

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O2

void __thiscall
duckdb::BatchedDataCollection::Append
          (BatchedDataCollection *this,DataChunk *input,idx_t batch_index)

{
  unsigned_long __p;
  BufferManager *args;
  Allocator *args_00;
  pointer this_00;
  ColumnDataCollection *this_01;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  new_collection;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_40;
  pair<unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>
  local_38;
  optional_ptr<duckdb::ColumnDataCollection,_true> local_28;
  
  local_28.ptr = (this->last_collection).collection;
  if (local_28.ptr == (ColumnDataCollection *)0x0) {
    local_40._M_head_impl = (ColumnDataCollection *)0x0;
    if (this->buffer_managed == true) {
      args = BufferManager::GetBufferManager(this->context);
      make_uniq<duckdb::ColumnDataCollection,duckdb::BufferManager&,duckdb::vector<duckdb::LogicalType,true>&>
                ((duckdb *)&local_38,args,&this->types);
    }
    else {
      args_00 = Allocator::DefaultAllocator();
      make_uniq<duckdb::ColumnDataCollection,duckdb::Allocator&,duckdb::vector<duckdb::LogicalType,true>&>
                ((duckdb *)&local_38,args_00,&this->types);
    }
  }
  else {
    if ((this->last_collection).batch_index == batch_index) goto LAB_0027e3b8;
    local_40._M_head_impl = (ColumnDataCollection *)0x0;
    make_uniq<duckdb::ColumnDataCollection,duckdb::ColumnDataCollection&>
              ((duckdb *)&local_38,local_28.ptr);
  }
  __p = local_38.first;
  local_38.first = 0;
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)&local_40,(pointer)__p);
  ::std::
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)&local_38);
  (this->last_collection).collection = local_40._M_head_impl;
  (this->last_collection).batch_index = batch_index;
  this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
            ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                          *)&local_40);
  ColumnDataCollection::InitializeAppend(this_00,&(this->last_collection).append_state);
  local_28.ptr = local_40._M_head_impl;
  local_38.second.
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
         )local_40._M_head_impl;
  local_40._M_head_impl = (ColumnDataCollection *)0x0;
  local_38.first = batch_index;
  ::std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>>
  ::
  _M_emplace_unique<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>>
              *)&this->data,&local_38);
  ::std::
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
  ~unique_ptr(&local_38.second.
               super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             );
  ::std::
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)&local_40);
LAB_0027e3b8:
  this_01 = optional_ptr<duckdb::ColumnDataCollection,_true>::operator->(&local_28);
  ColumnDataCollection::Append(this_01,&(this->last_collection).append_state,input);
  return;
}

Assistant:

void BatchedDataCollection::Append(DataChunk &input, idx_t batch_index) {
	D_ASSERT(batch_index != DConstants::INVALID_INDEX);
	optional_ptr<ColumnDataCollection> collection;
	if (last_collection.collection && last_collection.batch_index == batch_index) {
		// we are inserting into the same collection as before: use it directly
		collection = last_collection.collection;
	} else {
		// new collection: check if there is already an entry
		D_ASSERT(data.find(batch_index) == data.end());
		unique_ptr<ColumnDataCollection> new_collection;
		if (last_collection.collection) {
			new_collection = make_uniq<ColumnDataCollection>(*last_collection.collection);
		} else if (buffer_managed) {
			new_collection = make_uniq<ColumnDataCollection>(BufferManager::GetBufferManager(context), types);
		} else {
			new_collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);
		}
		last_collection.collection = new_collection.get();
		last_collection.batch_index = batch_index;
		new_collection->InitializeAppend(last_collection.append_state);
		collection = new_collection.get();
		data.insert(make_pair(batch_index, std::move(new_collection)));
	}
	collection->Append(last_collection.append_state, input);
}